

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O1

string * __thiscall
glcts::(anonymous_namespace)::GatherBase::TextBody_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  long *plVar1;
  long lVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  bool bVar8;
  string str_if;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  ulong *local_d0;
  long local_c8;
  ulong local_c0 [2];
  ulong *local_b0;
  long local_a8;
  ulong local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  (**(code **)(*this + 0x100))(local_90);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1b38a7b);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_1a0 = *plVar4;
    lStack_198 = plVar1[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *plVar4;
    local_1b0 = (long *)*plVar1;
  }
  local_1a8 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_130 = &local_120;
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_120 = *plVar4;
    lStack_118 = plVar1[3];
  }
  else {
    local_120 = *plVar4;
    local_130 = (long *)*plVar1;
  }
  local_128 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  (**(code **)(*this + 0xb8))(&local_1b0,this);
  lVar2 = std::__cxx11::string::find((char)&local_1b0,0x75);
  bVar8 = true;
  if (lVar2 == -1) {
    (**(code **)(*this + 0xb8))(local_90,this);
    lVar2 = std::__cxx11::string::find((char)local_90,0x69);
    bVar8 = lVar2 != -1;
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (bVar8) {
    (**(code **)(*this + 0x100))(&local_190);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x1b38ac0);
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_160 = *plVar4;
      lStack_158 = plVar1[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar4;
      local_170 = (long *)*plVar1;
    }
    local_168 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_170);
    plVar4 = plVar1 + 2;
    if ((long *)*plVar1 == plVar4) {
      local_1a0 = *plVar4;
      lStack_198 = plVar1[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *plVar4;
      local_1b0 = (long *)*plVar1;
    }
    local_1a8 = plVar1[1];
    *plVar1 = (long)plVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_1b0);
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,local_1a0 + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
  }
  (**(code **)(*this + 0xd0))(local_50);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x1b38ad0);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar5 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar5) {
    local_100 = *puVar5;
    uStack_f8 = (undefined4)plVar1[3];
    uStack_f4 = *(undefined4 *)((long)plVar1 + 0x1c);
    local_110 = &local_100;
  }
  else {
    local_100 = *puVar5;
    local_110 = (ulong *)*plVar1;
  }
  local_108 = plVar1[1];
  *plVar1 = (long)puVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  (**(code **)(*this + 0xb8))(&local_b0,this);
  uVar7 = 0xf;
  if (local_110 != &local_100) {
    uVar7 = local_100;
  }
  if (uVar7 < (ulong)(local_a8 + local_108)) {
    uVar7 = 0xf;
    if (local_b0 != local_a0) {
      uVar7 = local_a0[0];
    }
    if (uVar7 < (ulong)(local_a8 + local_108)) goto LAB_00c0ef25;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_110);
  }
  else {
LAB_00c0ef25:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_b0);
  }
  local_150 = &local_140;
  plVar1 = puVar3 + 2;
  if ((long *)*puVar3 == plVar1) {
    local_140 = *plVar1;
    uStack_138 = puVar3[3];
  }
  else {
    local_140 = *plVar1;
    local_150 = (long *)*puVar3;
  }
  local_148 = puVar3[1];
  *puVar3 = plVar1;
  puVar3[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_150);
  puVar5 = (ulong *)(plVar1 + 2);
  if ((ulong *)*plVar1 == puVar5) {
    local_e0 = *puVar5;
    uStack_d8 = (undefined4)plVar1[3];
    uStack_d4 = *(undefined4 *)((long)plVar1 + 0x1c);
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar5;
    local_f0 = (ulong *)*plVar1;
  }
  local_e8 = plVar1[1];
  *plVar1 = (long)puVar5;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  (**(code **)(*this + 200))(&local_d0,this);
  uVar7 = 0xf;
  if (local_f0 != &local_e0) {
    uVar7 = local_e0;
  }
  if (uVar7 < (ulong)(local_c8 + local_e8)) {
    uVar7 = 0xf;
    if (local_d0 != local_c0) {
      uVar7 = local_c0[0];
    }
    if ((ulong)(local_c8 + local_e8) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f0);
      goto LAB_00c0f088;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_d0);
LAB_00c0f088:
  local_190 = &local_180;
  plVar1 = puVar3 + 2;
  if ((long *)*puVar3 == plVar1) {
    local_180 = *plVar1;
    uStack_178 = puVar3[3];
  }
  else {
    local_180 = *plVar1;
    local_190 = (long *)*puVar3;
  }
  local_188 = puVar3[1];
  *puVar3 = plVar1;
  puVar3[1] = 0;
  *(undefined1 *)plVar1 = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_190);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_160 = *plVar4;
    lStack_158 = plVar1[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *plVar4;
    local_170 = (long *)*plVar1;
  }
  local_168 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_170,(ulong)local_130);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_1a0 = *plVar4;
    lStack_198 = plVar1[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *plVar4;
    local_1b0 = (long *)*plVar1;
  }
  local_1a8 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar1 + 2);
  if ((size_type *)*plVar1 == psVar6) {
    lVar2 = plVar1[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar1;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar1[1];
  *plVar1 = (long)psVar6;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TextBody()
	{
		std::string str_if = "    if (all(lessThanEqual(abs(tmp - " + Expected() + "), vec4(0.039)))) {           \n";
		if (Type().find('u') != std::string::npos || Type().find('i') != std::string::npos)
		{
			str_if = "    if (tmp == " + Expected() + ") {           \n";
		}
		return "vec4 test_function(vec4 p) {                                                                         "
			   "\n" +
			   Offset() + "    mediump " + Type() + " tmp = " + Gather() +
			   ";                                                   \n" + str_if +
			   "        return vec4(0.0, 1.0, 0.0, 1.0);                                                             \n"
			   "    } else {                                                                                         \n"
			   "        return vec4(float(tmp.x), float(tmp.y), float(tmp.z), float(tmp.w));                         \n"
			   "    }                                                                                                \n"
			   "}\n";
	}